

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t sse42_despace_to(char *bytes,size_t howmany,char *out)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  ulong in_RCX;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  if (howmany < 0x10) {
    uVar4 = 0;
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    auVar7._8_4_ = 0x200a0d20;
    auVar7._0_8_ = 0x200a0d20200a0d20;
    auVar7._12_4_ = 0x200a0d20;
    uVar5 = 0;
    do {
      vpcmpestri_avx(auVar7,*(undefined1 (*) [16])(bytes + uVar5),0);
      iVar3 = (int)in_RCX;
      lVar6 = (long)(int)((uint)(iVar3 < 0x10) + iVar3);
      uVar4 = uVar5 + lVar6;
      *(undefined1 (*) [16])(out + sVar2) = *(undefined1 (*) [16])(bytes + uVar5);
      sVar2 = (long)iVar3 + sVar2;
      in_RCX = uVar5 + 0xf + lVar6;
      uVar5 = uVar4;
    } while (in_RCX < howmany);
  }
  if (uVar4 < howmany) {
    do {
      bVar1 = bytes[uVar4];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        out[sVar2] = bVar1;
        sVar2 = sVar2 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (howmany != uVar4);
  }
  return sVar2;
}

Assistant:

size_t sse42_despace_to(const char *restrict bytes,
                                      size_t howmany, char *restrict out) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany;) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int result =
        _mm_cmpestri(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
    i += result + (result < 16);
    _mm_storeu_si128((__m128i *)(out + pos), x);
    pos += result;
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    out[pos++] = c;
  }
  return pos;
}